

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O0

void hexdumpwords<unsigned_char*>(string *str,uchar *buf,size_t nLength,char sep)

{
  uint16_t w;
  char *local_30;
  char *p;
  size_t sStack_20;
  char sep_local;
  size_t nLength_local;
  uchar *buf_local;
  string *str_local;
  
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)str);
  std::__cxx11::string::size();
  local_30 = (char *)std::__cxx11::string::operator[]((ulong)str);
  sStack_20 = nLength;
  nLength_local = (size_t)buf;
  while (sStack_20 != 0) {
    *local_30 = sep;
    w = get16le<unsigned_char*>((uchar *)nLength_local);
    word2hexchars(w,local_30 + 1);
    local_30 = local_30 + 5;
    nLength_local = nLength_local + 2;
    sStack_20 = sStack_20 - 1;
  }
  return;
}

Assistant:

void hexdumpwords(std::string &str, I buf, size_t nLength, char sep=' ')
{
    str.resize(str.size()+nLength*5);
    char *p= &str[str.size()-nLength*5];
    while(nLength--)
    {
        *p++ = sep;
        word2hexchars(get16le(buf), p); p+=4; buf+=2;
    }
}